

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O1

void csrot(int n,complex<float> *cx,int incx,complex<float> *cy,int incy,float c,float s)

{
  complex<float> *pcVar1;
  ulong uVar2;
  complex<float> *pcVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pcVar1 = cy + (incy >> 0x1f & (1 - n) * incy);
      pcVar3 = cx + (incx >> 0x1f & (1 - n) * incx);
      do {
        fVar4 = (float)pcVar3->_M_value;
        fVar5 = (float)(pcVar3->_M_value >> 0x20);
        fVar6 = (float)pcVar1->_M_value;
        fVar7 = (float)(pcVar1->_M_value >> 0x20);
        pcVar1->_M_value = CONCAT44(fVar7 * c - fVar5 * s,fVar6 * c - fVar4 * s);
        pcVar3->_M_value = CONCAT44(fVar7 * s + fVar5 * c,fVar6 * s + fVar4 * c);
        pcVar1 = pcVar1 + incy;
        pcVar3 = pcVar3 + incx;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar2 = 0;
    do {
      fVar4 = (float)cx[uVar2]._M_value;
      fVar5 = (float)(cx[uVar2]._M_value >> 0x20);
      fVar6 = (float)cy[uVar2]._M_value;
      fVar7 = (float)(cy[uVar2]._M_value >> 0x20);
      cy[uVar2]._M_value = CONCAT44(fVar7 * c - fVar5 * s,fVar6 * c - fVar4 * s);
      cx[uVar2]._M_value = CONCAT44(fVar7 * s + fVar5 * c,fVar6 * s + fVar4 * c);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void csrot ( int n, complex <float> cx[], int incx, complex <float> cy[],
  int incy, float c, float s )

//****************************************************************************80
//
//  Purpose:
//
//    CSROT applies a plane rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    The cosine C and sine S are real and the vectors CX and CY are complex.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <float> CX[], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of CY.
//
//    Input, float C, S, parameters (presumably the cosine and sine of
//    some angle) that define a plane rotation.
//
{
  complex <float> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = c * cx[i] + s * cy[i];
      cy[i] = c * cy[i] - s * cx[i];
      cx[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp  = c * cx[ix] + s * cy[iy];
      cy[iy] = c * cy[iy] - s * cx[ix];
      cx[ix] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}